

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O2

void __thiscall
HFactor::btranU(HFactor *this,HVector *rhs,double expected_density,
               HighsTimerClock *factor_timer_clock_pointer)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer piVar7;
  pointer piVar8;
  pointer piVar9;
  pointer pdVar10;
  pointer piVar11;
  pointer pdVar12;
  int iVar13;
  ulong uVar14;
  HighsInt k;
  HighsInt factor_clock;
  int iVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  double dVar19;
  double dVar20;
  FactorTimer factor_timer;
  
  FactorTimer::start(&factor_timer,0x1f,factor_timer_clock_pointer);
  if (this->update_method == 2) {
    FactorTimer::start(&factor_timer,0x20,factor_timer_clock_pointer);
    btranPF(this,rhs);
    FactorTimer::stop(&factor_timer,0x20,factor_timer_clock_pointer);
  }
  if (((0.15 < expected_density) || (rhs->count < 0)) ||
     (0.05 < (double)rhs->count * this->inv_num_row)) {
    FactorTimer::start(&factor_timer,0x22,factor_timer_clock_pointer);
    piVar5 = (rhs->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (rhs->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = (this->ur_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar8 = (this->ur_lastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar9 = (this->ur_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar10 = (this->ur_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar11 = (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar14 = (ulong)((long)(this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_finish - (long)piVar11) >> 2;
    pdVar12 = (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar17 = 0;
    iVar13 = (int)uVar14;
    uVar18 = 0;
    if (0 < iVar13) {
      uVar18 = uVar14 & 0xffffffff;
    }
    dVar19 = 0.0;
    iVar15 = 0;
    for (; uVar17 != uVar18; uVar17 = uVar17 + 1) {
      iVar1 = piVar11[uVar17];
      lVar16 = (long)iVar1;
      if (lVar16 != -1) {
        if (ABS(pdVar6[lVar16]) <= 1e-14) {
          pdVar6[lVar16] = 0.0;
        }
        else {
          dVar20 = pdVar6[lVar16] / pdVar12[uVar17];
          piVar5[iVar15] = iVar1;
          pdVar6[lVar16] = dVar20;
          iVar1 = piVar7[uVar17];
          iVar2 = piVar8[uVar17];
          iVar3 = this->num_row;
          for (lVar16 = (long)iVar1; lVar16 < iVar2; lVar16 = lVar16 + 1) {
            iVar4 = piVar9[lVar16];
            pdVar6[iVar4] = pdVar10[lVar16] * -dVar20 + pdVar6[iVar4];
          }
          if ((long)iVar3 <= (long)uVar17) {
            dVar19 = (double)(iVar2 - iVar1) + dVar19;
          }
          iVar15 = iVar15 + 1;
        }
      }
    }
    rhs->count = iVar15;
    rhs->synthetic_tick =
         dVar19 * 15.0 + (double)((iVar13 - this->num_row) * 10) + rhs->synthetic_tick;
    factor_clock = 0x22;
  }
  else {
    factor_clock = 0x23;
    FactorTimer::start(&factor_timer,0x23,factor_timer_clock_pointer);
    solveHyper(this->num_row,
               (this->u_pivot_lookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->ur_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->ur_lastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->ur_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->ur_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,rhs);
  }
  FactorTimer::stop(&factor_timer,factor_clock,factor_timer_clock_pointer);
  iVar13 = this->update_method;
  if (iVar13 == 1) {
    FactorTimer::start(&factor_timer,0x24,factor_timer_clock_pointer);
    HVectorBase<double>::tight(rhs);
    HVectorBase<double>::pack(rhs);
    btranFT(this,rhs);
    HVectorBase<double>::tight(rhs);
    FactorTimer::stop(&factor_timer,0x24,factor_timer_clock_pointer);
    iVar13 = this->update_method;
  }
  if (iVar13 == 3) {
    FactorTimer::start(&factor_timer,0x25,factor_timer_clock_pointer);
    HVectorBase<double>::tight(rhs);
    HVectorBase<double>::pack(rhs);
    btranMPF(this,rhs);
    HVectorBase<double>::tight(rhs);
    FactorTimer::stop(&factor_timer,0x25,factor_timer_clock_pointer);
  }
  FactorTimer::stop(&factor_timer,0x1f,factor_timer_clock_pointer);
  return;
}

Assistant:

void HFactor::btranU(HVector& rhs, const double expected_density,
                     HighsTimerClock* factor_timer_clock_pointer) const {
  FactorTimer factor_timer;
  factor_timer.start(FactorBtranUpper, factor_timer_clock_pointer);
  if (update_method == kUpdateMethodPf) {
    assert(!(update_method == kUpdateMethodPf));
    factor_timer.start(FactorBtranUpperPF, factor_timer_clock_pointer);
    btranPF(rhs);
    factor_timer.stop(FactorBtranUpperPF, factor_timer_clock_pointer);
  }

  // The regular part
  //
  // Determine style of solve
  const double current_density = 1.0 * rhs.count * inv_num_row;
  const bool sparse_solve = rhs.count < 0 || current_density > kHyperCancel ||
                            expected_density > kHyperBtranU;
  if (sparse_solve) {
    factor_timer.start(FactorBtranUpperSps, factor_timer_clock_pointer);
    // Alias to non constant
    double rhs_synthetic_tick = 0;
    // Alias to RHS
    double* rhs_array = rhs.array.data();
    HighsInt* rhs_index = rhs.index.data();
    // Alias to factor U
    const HighsInt* ur_start = this->ur_start.data();
    const HighsInt* ur_end = this->ur_lastp.data();
    const HighsInt* ur_index = this->ur_index.data();
    const double* ur_value = this->ur_value.data();
    // Local accumulation of RHS count
    HighsInt rhs_count = 0;
    // Transform
    HighsInt u_pivot_count = u_pivot_index.size();
    for (HighsInt i_logic = 0; i_logic < u_pivot_count; i_logic++) {
      // Skip void
      if (u_pivot_index[i_logic] == -1) continue;
      // Normal part
      const HighsInt pivotRow = u_pivot_index[i_logic];
      double pivot_multiplier = rhs_array[pivotRow];
      if (fabs(pivot_multiplier) > kHighsTiny) {
        pivot_multiplier /= u_pivot_value[i_logic];
        rhs_index[rhs_count++] = pivotRow;
        rhs_array[pivotRow] = pivot_multiplier;
        const HighsInt start = ur_start[i_logic];
        const HighsInt end = ur_end[i_logic];
        if (i_logic >= num_row) {
          rhs_synthetic_tick += (end - start);
        }
        for (HighsInt k = start; k < end; k++)
          rhs_array[ur_index[k]] -= pivot_multiplier * ur_value[k];
      } else
        rhs_array[pivotRow] = 0;
    }
    // Save the count
    rhs.count = rhs_count;
    rhs.synthetic_tick +=
        rhs_synthetic_tick * 15 + (u_pivot_count - num_row) * 10;
    factor_timer.stop(FactorBtranUpperSps, factor_timer_clock_pointer);
  } else {
    factor_timer.start(FactorBtranUpperHyper, factor_timer_clock_pointer);
    solveHyper(num_row, u_pivot_lookup.data(), u_pivot_index.data(),
               u_pivot_value.data(), &ur_start[0], ur_lastp.data(),
               &ur_index[0], &ur_value[0], &rhs);
    factor_timer.stop(FactorBtranUpperHyper, factor_timer_clock_pointer);
  }

  // The update part
  assert(rhs.count >= 0);
  if (update_method == kUpdateMethodFt) {
    factor_timer.start(FactorBtranUpperFT, factor_timer_clock_pointer);
    rhs.tight();
    rhs.pack();
    btranFT(rhs);
    rhs.tight();
    factor_timer.stop(FactorBtranUpperFT, factor_timer_clock_pointer);
  }
  if (update_method == kUpdateMethodMpf) {
    assert(!(update_method == kUpdateMethodMpf));
    factor_timer.start(FactorBtranUpperMPF, factor_timer_clock_pointer);
    rhs.tight();
    rhs.pack();
    btranMPF(rhs);
    rhs.tight();
    factor_timer.stop(FactorBtranUpperMPF, factor_timer_clock_pointer);
  }
  factor_timer.stop(FactorBtranUpper, factor_timer_clock_pointer);
}